

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

XML_Convert_Result
utf8_toUtf8(ENCODING *UNUSED_enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  char *from;
  char *pcVar1;
  XML_Convert_Result XVar2;
  long lVar3;
  char *fromLimBefore;
  size_t __n;
  bool bVar4;
  char *local_50;
  char *local_48;
  char **local_40;
  char **local_38;
  
  from = *fromP;
  local_48 = *toP;
  lVar3 = (long)toLim - (long)local_48;
  local_50 = fromLim;
  if (lVar3 < (long)fromLim - (long)from) {
    local_50 = from + lVar3;
  }
  pcVar1 = local_50;
  local_40 = fromP;
  local_38 = toP;
  _INTERNAL_trim_to_complete_utf8_characters(from,&local_50);
  bVar4 = local_50 < pcVar1;
  __n = (long)local_50 - (long)from;
  memcpy(local_48,from,__n);
  *local_40 = *local_40 + __n;
  *local_38 = *local_38 + __n;
  XVar2 = XML_CONVERT_OUTPUT_EXHAUSTED;
  if ((long)fromLim - (long)from <= lVar3) {
    XVar2 = (uint)bVar4;
  }
  return XVar2;
}

Assistant:

static enum XML_Convert_Result PTRCALL
utf8_toUtf8(const ENCODING *UNUSED_P(enc),
            const char **fromP, const char *fromLim,
            char **toP, const char *toLim)
{
  bool input_incomplete = false;
  bool output_exhausted = false;

  /* Avoid copying partial characters (due to limited space). */
  const ptrdiff_t bytesAvailable = fromLim - *fromP;
  const ptrdiff_t bytesStorable = toLim - *toP;
  if (bytesAvailable > bytesStorable) {
    fromLim = *fromP + bytesStorable;
    output_exhausted = true;
  }

  /* Avoid copying partial characters (from incomplete input). */
  {
    const char * const fromLimBefore = fromLim;
    _INTERNAL_trim_to_complete_utf8_characters(*fromP, &fromLim);
    if (fromLim < fromLimBefore) {
      input_incomplete = true;
    }
  }

  {
    const ptrdiff_t bytesToCopy = fromLim - *fromP;
    memcpy(*toP, *fromP, bytesToCopy);
    *fromP += bytesToCopy;
    *toP += bytesToCopy;
  }

  if (output_exhausted)  /* needs to go first */
    return XML_CONVERT_OUTPUT_EXHAUSTED;
  else if (input_incomplete)
    return XML_CONVERT_INPUT_INCOMPLETE;
  else
    return XML_CONVERT_COMPLETED;
}